

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

string * __thiscall
vkt::SpirVAssembly::getAssemblyTypeDeclaration_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,NumberType type)

{
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  NumberType type_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"OpTypeInt 32 1",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"OpTypeInt 32 0",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else if (local_14 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"OpTypeFloat 32",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  return __return_storage_ptr__;
}

Assistant:

const string getAssemblyTypeDeclaration (const NumberType type)
{
	switch (type)
	{
		case TYPE_INT:		return "OpTypeInt 32 1";
		case TYPE_UINT:		return "OpTypeInt 32 0";
		case TYPE_FLOAT:	return "OpTypeFloat 32";
		default:			DE_ASSERT(false); return "";
	}
}